

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale_tools.h
# Opt level: O0

undefined8 to_correct_string<wchar_t>(string *e,locale *param_2)

{
  undefined8 in_RDI;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"UTF-8",&local_39);
  booster::locale::conv::to_utf<wchar_t>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (method_type)((ulong)&local_39 >> 0x20));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

std::basic_string<Char> to_correct_string(std::string const &e,std::locale /*l*/)
{
    return booster::locale::conv::to_utf<Char>(e,"UTF-8");
}